

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_move_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_19c9c9::CpuMoveTest_tsx_sets_z_flag_Test::~CpuMoveTest_tsx_sets_z_flag_Test
          (CpuMoveTest_tsx_sets_z_flag_Test *this)

{
  n_e_s::core::test::CpuTest::~CpuTest((CpuTest *)this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuMoveTest, tsx_sets_z_flag) {
    stage_instruction(TSX);
    move_test_sets_z(&expected.x, &expected.sp, &registers.sp);
}